

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::ArrayInputStream::BackUp(ArrayInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  string *local_90;
  string *absl_log_internal_check_op_result_2;
  undefined8 local_80;
  LogMessageFatal local_78 [23];
  Voidify local_61;
  string *local_60;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_48 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  ArrayInputStream *pAStack_10;
  int count_local;
  ArrayInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pAStack_10 = this;
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(this->last_returned_size_);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_
                       (iVar1,iVar2,"last_returned_size_ > 0");
  if (local_20 != (string *)0x0) {
    local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x3e,local_48._0_8_,local_48._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [55])
                               "BackUp() can only be called after a successful Next().");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(this->last_returned_size_);
  local_60 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,iVar2,"count <= last_returned_size_");
  if (local_60 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_80 = auVar4._8_8_;
    absl_log_internal_check_op_result_2 = auVar4._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x40,absl_log_internal_check_op_result_2,local_80);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_90 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"count >= 0");
  if (local_90 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x41,auVar4._0_8_,auVar4._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a8);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
  }
  this->position_ = this->position_ - absl_log_internal_check_op_result._4_4_;
  this->last_returned_size_ = 0;
  return;
}

Assistant:

void ArrayInputStream::BackUp(int count) {
  ABSL_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  ABSL_CHECK_LE(count, last_returned_size_);
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}